

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::Columns(int columns_count,char *id,bool border)

{
  ImGuiWindow *pIVar1;
  ImGuiColumnsSet *pIVar2;
  
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  pIVar2 = (pIVar1->DC).ColumnsSet;
  if (pIVar2 != (ImGuiColumnsSet *)0x0) {
    if ((pIVar2->Count == columns_count) && (pIVar2->Flags == (uint)!border)) {
      return;
    }
    EndColumns();
  }
  if (columns_count == 1) {
    return;
  }
  BeginColumns(id,columns_count,(uint)!border);
  return;
}

Assistant:

void ImGui::Columns(int columns_count, const char* id, bool border)
{
    ImGuiWindow* window = GetCurrentWindow();
    IM_ASSERT(columns_count >= 1);

    ImGuiColumnsFlags flags = (border ? 0 : ImGuiColumnsFlags_NoBorder);
    //flags |= ImGuiColumnsFlags_NoPreserveWidths; // NB: Legacy behavior
    if (window->DC.ColumnsSet != NULL && window->DC.ColumnsSet->Count == columns_count && window->DC.ColumnsSet->Flags == flags)
        return;

    if (window->DC.ColumnsSet != NULL)
        EndColumns();

    if (columns_count != 1)
        BeginColumns(id, columns_count, flags);
}